

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock.cpp
# Opt level: O0

int main(void)

{
  int __fd;
  int iVar1;
  SNMP_ERROR_RESPONSE SVar2;
  SortableOIDType *this;
  IntegerCallback *this_00;
  ssize_t sVar3;
  allocator local_521;
  string local_520 [39];
  allocator local_4f9;
  string local_4f8 [32];
  SNMP_ERROR_RESPONSE local_4d8;
  uint local_4d4;
  SNMP_ERROR_RESPONSE response;
  int responseLength;
  IntegerCallback *local_4c8;
  IntegerCallback *cb;
  int *testInt;
  allocator local_4a1;
  string local_4a0 [32];
  SortableOIDType *local_480;
  SortableOIDType *oid;
  char buf [29];
  uint local_44c;
  int i;
  char *prefix;
  int n;
  int len;
  sockaddr_in cliaddr;
  sockaddr_in servaddr;
  char buffer [1024];
  int sockfd;
  
  __fd = socket(2,2,0);
  if (__fd < 0) {
    perror("socket creation failed");
    exit(1);
  }
  memset(cliaddr.sin_zero,0,0x10);
  memset(&n,0,0x10);
  cliaddr.sin_zero[0] = '\x02';
  cliaddr.sin_zero[1] = '\0';
  cliaddr.sin_zero[4] = '\0';
  cliaddr.sin_zero[5] = '\0';
  cliaddr.sin_zero[6] = '\0';
  cliaddr.sin_zero[7] = '\0';
  cliaddr.sin_zero._2_2_ = htons(0xa1);
  iVar1 = bind(__fd,(sockaddr *)cliaddr.sin_zero,0x10);
  if (-1 < iVar1) {
    prefix._4_4_ = 0x10;
    printf("creating objs\n");
    for (local_44c = 29999; 0 < (int)local_44c; local_44c = local_44c - 1) {
      buf[8] = '\0';
      buf[9] = '\0';
      buf[10] = '\0';
      buf[0xb] = '\0';
      buf[0xc] = '\0';
      buf[0xd] = '\0';
      buf[0xe] = '\0';
      buf[0xf] = '\0';
      buf[0x10] = '\0';
      buf[0x11] = '\0';
      buf[0x12] = '\0';
      buf[0x13] = '\0';
      buf[0x14] = '\0';
      oid = (SortableOIDType *)0x0;
      buf[0] = '\0';
      buf[1] = '\0';
      buf[2] = '\0';
      buf[3] = '\0';
      buf[4] = '\0';
      buf[5] = '\0';
      buf[6] = '\0';
      buf[7] = '\0';
      sprintf((char *)&oid,"%s%d",".1.3.6.1.4.1.5.",(ulong)local_44c);
      this = (SortableOIDType *)operator_new(0x68);
      testInt._3_1_ = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4a0,(char *)&oid,&local_4a1);
      SortableOIDType::SortableOIDType(this,(string *)local_4a0);
      testInt._3_1_ = 0;
      std::__cxx11::string::~string(local_4a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
      local_480 = this;
      cb = (IntegerCallback *)calloc(1,4);
      iVar1 = rand();
      *(int *)&(cb->super_ValueCallback)._vptr_ValueCallback = iVar1;
      this_00 = (IntegerCallback *)operator_new(0x28);
      IntegerCallback::IntegerCallback(this_00,local_480,(int *)cb);
      _response = this_00;
      local_4c8 = this_00;
      std::deque<ValueCallback_*,_std::allocator<ValueCallback_*>_>::push_back
                (&callbacks,(value_type *)&response);
    }
    printf("sorting\n");
    sort_handlers(&callbacks);
    printf("ready\n");
    do {
      do {
        sVar3 = recvfrom(__fd,servaddr.sin_zero,0x400,0x100,(sockaddr *)&n,
                         (socklen_t *)((long)&prefix + 4));
        iVar1 = (int)sVar3;
        servaddr.sin_zero[iVar1] = '\0';
        local_4d4 = 0;
        prefix._0_4_ = iVar1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_4f8,"public",&local_4f9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_520,"pub",&local_521);
        SVar2 = handlePacket(servaddr.sin_zero,iVar1,(int *)&local_4d4,0x400,&callbacks,
                             (string *)local_4f8,(string *)local_520,(informCB)0x0,(void *)0x0);
        std::__cxx11::string::~string(local_520);
        std::allocator<char>::~allocator((allocator<char> *)&local_521);
        std::__cxx11::string::~string(local_4f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
        local_4d8 = SVar2;
        printf("SNMP Packet : %d, len:%d\n",(ulong)(uint)SVar2,(ulong)local_4d4);
      } while (local_4d8 < SNMP_NO_ERROR);
      sendto(__fd,servaddr.sin_zero,(long)(int)local_4d4,0,(sockaddr *)&n,prefix._4_4_);
    } while( true );
  }
  perror("bind failed");
  exit(1);
}

Assistant:

int main() { 
    int sockfd; 
    char buffer[MAXLINE]; 
    struct sockaddr_in servaddr, cliaddr; 
      
    // Creating socket file descriptor 
    if ( (sockfd = socket(AF_INET, SOCK_DGRAM, 0)) < 0 ) { 
        perror("socket creation failed"); 
        exit(EXIT_FAILURE); 
    } 
      
    memset(&servaddr, 0, sizeof(servaddr)); 
    memset(&cliaddr, 0, sizeof(cliaddr)); 
      
    // Filling server information 
    servaddr.sin_family    = AF_INET; // IPv4 
    servaddr.sin_addr.s_addr = INADDR_ANY; 
    servaddr.sin_port = htons(PORT); 
      
    // Bind the socket with the server address 
    if ( bind(sockfd, (const struct sockaddr *)&servaddr,  
            sizeof(servaddr)) < 0 ) 
    { 
        perror("bind failed"); 
        exit(EXIT_FAILURE); 
    } 
      
    int len, n; 
  
    len = sizeof(cliaddr);  //len is value/resuslt 

    // IntegerCallback* intCallback = new IntegerCallback(new OIDType(".1.3.6.1.4.1.5.0"));
    // intCallback->value = &testingInt;
    // callbacks.push_back(intCallback);

    const char* prefix = ".1.3.6.1.4.1.5.";

    printf("creating objs\n");


    for(int i = 29999; i > 0; i--){
        char buf[29] = {0};
        sprintf(buf, "%s%d", prefix, i);
        auto* oid = new SortableOIDType(buf);

        int* testInt = (int*)calloc(1, sizeof(int));
        *testInt = rand();
        IntegerCallback* cb = new IntegerCallback(oid, testInt);
        callbacks.push_back(cb);
    }

    printf("sorting\n");

    sort_handlers(callbacks);

    printf("ready\n");

    while(true){
        n = recvfrom(sockfd, (char *)buffer, MAXLINE,  
                    MSG_WAITALL, ( struct sockaddr *) &cliaddr, 
                    (socklen_t*)&len); 
        buffer[n] = '\0'; 

        int responseLength = 0;

        SNMP_ERROR_RESPONSE response = handlePacket((uint8_t*)buffer, n, &responseLength, 1024, callbacks, "public", "pub");

        printf("SNMP Packet : %d, len:%d\n", response, responseLength); 
        if(response > 0){
            sendto(sockfd, (const char *)buffer, responseLength,  
            0, (const struct sockaddr *) &cliaddr, 
                len);
        }
        
    }
    return 0; 
}